

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<Fad<float>_>::TimesBetaPlusZ
          (TPZFMatrix<Fad<float>_> *this,Fad<float> *beta,TPZFMatrix<Fad<float>_> *z)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Fad<float> *in_RDI;
  Fad<float> *unaff_retaddr;
  Fad<float> *pz;
  Fad<float> *ptlast;
  Fad<float> *pt;
  ulong local_20;
  
  local_20 = *(ulong *)(in_RDI + 1);
  lVar1 = *(long *)(in_RDI + 1);
  lVar2 = *(long *)&in_RDI->dx_;
  pfVar3 = (in_RDI->dx_).ptr_to_data;
  while (local_20 < (ulong)(lVar1 + lVar2 * (long)pfVar3 * 0x20)) {
    Fad<float>::operator*=<float,_nullptr>((Fad<float> *)z,pt);
    local_20 = local_20 + 0x20;
    Fad<float>::operator+=<float,_nullptr>(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::TimesBetaPlusZ(const TVar beta,const TPZFMatrix<TVar> &z) {
    // #ifdef USING_ATLAS
    // 	int size = fRow*fCol;
    // 	cblas_dscal(size,beta,fElem,1);
    // 	cblas_daxpy(size,1.,z.fElem,1,fElem,1);
    // #else
    
    TVar * pt = fElem,  *ptlast = fElem + this->fRow*this->fCol;
    TVar * pz = z.fElem;
    //	while(pt < ptlast) *pt++ *= (beta) + *pz++;
    while(pt < ptlast) {
        *pt *= (beta);
        *pt++ += *pz++;
    }
    // #endif
}